

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrPubkey_TweakAdd_Test::TestBody(SchnorrPubkey_TweakAdd_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  bool is_parity2;
  bool is_parity1;
  Privkey tweak_sk1;
  string local_158;
  Privkey key;
  Privkey tweak_sk2;
  AssertHelper local_f8;
  AssertionResult gtest_ar_2;
  SchnorrPubkey tweak_pubkey21;
  string exp_pubkey1;
  ByteData256 tweak2;
  SchnorrPubkey tweak_pubkey2;
  SchnorrPubkey tweak_pubkey1;
  string exp_pubkey2;
  ByteData256 tweak1;
  SchnorrPubkey tweak_pubkey22;
  
  std::__cxx11::string::string
            ((string *)&exp_pubkey1,
             "45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476",
             (allocator *)&exp_pubkey2);
  cfd::core::ByteData256::ByteData256(&tweak1,&exp_pubkey1);
  std::__cxx11::string::~string((string *)&exp_pubkey1);
  std::__cxx11::string::string
            ((string *)&exp_pubkey1,
             "0daf700e00c25a75feb3b747a5f31ba58f4a7c3c7b36eaceef7cb882a06a9bf1",
             (allocator *)&exp_pubkey2);
  cfd::core::ByteData256::ByteData256(&tweak2,&exp_pubkey1);
  std::__cxx11::string::~string((string *)&exp_pubkey1);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&tweak_pubkey1);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&tweak_pubkey2);
  is_parity1 = false;
  is_parity2 = false;
  std::__cxx11::string::string
            ((string *)&exp_pubkey1,
             "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440",
             (allocator *)&exp_pubkey2);
  std::__cxx11::string::string
            ((string *)&exp_pubkey2,
             "943203db3a9a8845a4aee1af81b76cb9ec60ab08d700df59a32426a4e6e1557b",
             (allocator *)&tweak_sk1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SchnorrPubkey::CreateTweakAdd
                ((SchnorrPubkey *)&tweak_sk1,&::pubkey,&tweak1,&is_parity1);
      cfd::core::ByteData256::operator=(&tweak_pubkey1.data_,(ByteData256 *)&tweak_sk1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sk1);
    }
  }
  else {
    testing::Message::Message((Message *)&tweak_sk1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tweak_sk2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xbe,
               "Expected: tweak_pubkey1 = pubkey.CreateTweakAdd(tweak1, &is_parity1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&tweak_sk2,(Message *)&tweak_sk1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tweak_sk2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tweak_sk1);
  }
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&tweak_sk1,&tweak_pubkey1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&tweak_sk2,"exp_pubkey1","tweak_pubkey1.GetHex()",&exp_pubkey1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tweak_sk1);
  std::__cxx11::string::~string((string *)&tweak_sk1);
  if ((byte)tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tweak_sk1);
    if (tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)tweak_sk2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xbf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&tweak_sk1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tweak_sk1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = is_parity1;
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (is_parity1 == false) {
    testing::Message::Message((Message *)&key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tweak_sk1,(internal *)&tweak_sk2,(AssertionResult *)"is_parity1","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xc0,(char *)tweak_sk1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&tweak_sk1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SchnorrPubkey::CreateTweakAdd
                ((SchnorrPubkey *)&tweak_sk1,&::pubkey,&tweak2,&is_parity2);
      cfd::core::ByteData256::operator=(&tweak_pubkey2.data_,(ByteData256 *)&tweak_sk1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sk1);
    }
  }
  else {
    testing::Message::Message((Message *)&tweak_sk1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tweak_sk2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xc2,
               "Expected: tweak_pubkey2 = pubkey.CreateTweakAdd(tweak2, &is_parity2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&tweak_sk2,(Message *)&tweak_sk1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tweak_sk2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tweak_sk1);
  }
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&tweak_sk1,&tweak_pubkey2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&tweak_sk2,"exp_pubkey2","tweak_pubkey2.GetHex()",&exp_pubkey2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tweak_sk1);
  std::__cxx11::string::~string((string *)&tweak_sk1);
  if ((byte)tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&tweak_sk1);
    if (tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)tweak_sk2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&tweak_sk1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tweak_sk1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = is_parity2 ^ 1;
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (is_parity2 != false) {
    testing::Message::Message((Message *)&key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tweak_sk1,(internal *)&tweak_sk2,(AssertionResult *)"is_parity2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xc4,(char *)tweak_sk1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&tweak_sk1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       cfd::core::SchnorrPubkey::IsTweaked(&tweak_pubkey1,&::pubkey,&tweak1,is_parity1);
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(byte)tweak_sk2.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tweak_sk1,(internal *)&tweak_sk2,
               (AssertionResult *)"tweak_pubkey1.IsTweaked(pubkey, tweak1, is_parity1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xc6,(char *)tweak_sk1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&tweak_sk1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       cfd::core::SchnorrPubkey::IsTweaked(&tweak_pubkey2,&::pubkey,&tweak2,is_parity2);
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(byte)tweak_sk2.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tweak_sk1,(internal *)&tweak_sk2,
               (AssertionResult *)"tweak_pubkey2.IsTweaked(pubkey, tweak2, is_parity2)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,199,(char *)tweak_sk1.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&tweak_sk1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  bVar1 = cfd::core::SchnorrPubkey::IsTweaked
                    (&tweak_pubkey1,&::pubkey,&tweak2,(bool)(is_parity1 ^ 1));
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = !bVar1;
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tweak_sk1,(internal *)&tweak_sk2,
               (AssertionResult *)"tweak_pubkey1.IsTweaked(pubkey, tweak2, !is_parity1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,200,(char *)tweak_sk1.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&tweak_sk1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  bVar1 = cfd::core::SchnorrPubkey::IsTweaked
                    (&tweak_pubkey2,&::pubkey,&tweak2,(bool)(is_parity2 ^ 1));
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = !bVar1;
  tweak_sk2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&tweak_sk1,(internal *)&tweak_sk2,
               (AssertionResult *)"tweak_pubkey2.IsTweaked(pubkey, tweak2, !is_parity2)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xc9,(char *)tweak_sk1.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)&key);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    std::__cxx11::string::~string((string *)&tweak_sk1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&key);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tweak_sk2.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::Privkey::Privkey(&tweak_sk1);
  cfd::core::Privkey::Privkey(&tweak_sk2);
  cfd::core::Privkey::Privkey(&key,&::sk);
  cfd::core::Privkey::CreateNegate((Privkey *)&local_158,&::sk);
  cfd::core::Privkey::operator=(&key,(Privkey *)&local_158);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Privkey::CreateTweakAdd((Privkey *)&local_158,&key,&tweak1);
      cfd::core::Privkey::operator=(&tweak_sk1,(Privkey *)&local_158);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
    }
  }
  else {
    testing::Message::Message((Message *)&local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tweak_pubkey21,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xcf,
               "Expected: tweak_sk1 = key.CreateTweakAdd(tweak1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tweak_pubkey21,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tweak_pubkey21);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Privkey::CreateTweakAdd((Privkey *)&local_158,&key,&tweak2);
      cfd::core::Privkey::operator=(&tweak_sk2,(Privkey *)&local_158);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158);
    }
  }
  else {
    testing::Message::Message((Message *)&local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tweak_pubkey21,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xd0,
               "Expected: tweak_sk2 = key.CreateTweakAdd(tweak2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tweak_pubkey21,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tweak_pubkey21);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  cfd::core::SchnorrPubkey::FromPrivkey(&tweak_pubkey21,&tweak_sk1,(bool *)0x0);
  cfd::core::SchnorrPubkey::FromPrivkey(&tweak_pubkey22,&tweak_sk2,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_158,&tweak_pubkey21);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_pubkey1","tweak_pubkey21.GetHex()",&exp_pubkey1,&local_158
            );
  std::__cxx11::string::~string((string *)&local_158);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_158,&tweak_pubkey22);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"exp_pubkey2","tweak_pubkey22.GetHex()",&exp_pubkey2,&local_158
            );
  std::__cxx11::string::~string((string *)&local_158);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_pubkey22);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_pubkey21);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sk2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sk1);
  std::__cxx11::string::~string((string *)&exp_pubkey2);
  std::__cxx11::string::~string((string *)&exp_pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_pubkey2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_pubkey1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak1);
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakAdd) {
  ByteData256 tweak1("45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476");
  ByteData256 tweak2("0daf700e00c25a75feb3b747a5f31ba58f4a7c3c7b36eaceef7cb882a06a9bf1");
  SchnorrPubkey tweak_pubkey1;
  SchnorrPubkey tweak_pubkey2;
  bool is_parity1 = false;
  bool is_parity2 = false;

  std::string exp_pubkey1 = "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440";
  std::string exp_pubkey2 = "943203db3a9a8845a4aee1af81b76cb9ec60ab08d700df59a32426a4e6e1557b";

  EXPECT_NO_THROW(tweak_pubkey1 = pubkey.CreateTweakAdd(tweak1, &is_parity1));
  EXPECT_EQ(exp_pubkey1, tweak_pubkey1.GetHex());
  EXPECT_TRUE(is_parity1);

  EXPECT_NO_THROW(tweak_pubkey2 = pubkey.CreateTweakAdd(tweak2, &is_parity2));
  EXPECT_EQ(exp_pubkey2, tweak_pubkey2.GetHex());
  EXPECT_FALSE(is_parity2);

  EXPECT_TRUE(tweak_pubkey1.IsTweaked(pubkey, tweak1, is_parity1));
  EXPECT_TRUE(tweak_pubkey2.IsTweaked(pubkey, tweak2, is_parity2));
  EXPECT_FALSE(tweak_pubkey1.IsTweaked(pubkey, tweak2, !is_parity1));
  EXPECT_FALSE(tweak_pubkey2.IsTweaked(pubkey, tweak2, !is_parity2));

  Privkey tweak_sk1;
  Privkey tweak_sk2;
  Privkey key = sk;
  if (pubkey_parity) key = sk.CreateNegate();
  EXPECT_NO_THROW(tweak_sk1 = key.CreateTweakAdd(tweak1));
  EXPECT_NO_THROW(tweak_sk2 = key.CreateTweakAdd(tweak2));

  SchnorrPubkey tweak_pubkey21 = SchnorrPubkey::FromPrivkey(tweak_sk1);
  SchnorrPubkey tweak_pubkey22 = SchnorrPubkey::FromPrivkey(tweak_sk2);
  EXPECT_EQ(exp_pubkey1, tweak_pubkey21.GetHex());
  EXPECT_EQ(exp_pubkey2, tweak_pubkey22.GetHex());
}